

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_query.c
# Opt level: O0

int dwarf_die_text(Dwarf_Die die,Dwarf_Half attrnum,char **ret_name,Dwarf_Error *error)

{
  Dwarf_Debug pDVar1;
  Dwarf_Debug ckdi_dbg;
  Dwarf_Error lerr;
  Dwarf_Attribute attr;
  Dwarf_Debug pDStack_38;
  int res;
  Dwarf_Debug dbg;
  Dwarf_Error *error_local;
  char **ret_name_local;
  Dwarf_Die pDStack_18;
  Dwarf_Half attrnum_local;
  Dwarf_Die die_local;
  
  pDStack_38 = (Dwarf_Debug)0x0;
  attr._4_4_ = 1;
  lerr = (Dwarf_Error)0x0;
  ckdi_dbg = (Dwarf_Debug)0x0;
  dbg = (Dwarf_Debug)error;
  error_local = (Dwarf_Error *)ret_name;
  ret_name_local._6_2_ = attrnum;
  pDStack_18 = die;
  if (die == (Dwarf_Die)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x34);
    die_local._4_4_ = 1;
  }
  else if (die->di_cu_context == (Dwarf_CU_Context_conflict)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x68);
    die_local._4_4_ = 1;
  }
  else {
    pDVar1 = die->di_cu_context->cc_dbg;
    if ((pDVar1 == (Dwarf_Debug)0x0) || (pDVar1->de_magic != 0xebfdebfd)) {
      _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                          "DW_DLE_DBG_NULL: accesing a cu context, Dwarf_Debug either null or it containsa stale Dwarf_Debug pointer"
                         );
      die_local._4_4_ = 1;
    }
    else {
      attr._4_4_ = dwarf_attr(die,attrnum,(Dwarf_Attribute *)&lerr,(Dwarf_Error *)&ckdi_dbg);
      pDStack_38 = pDStack_18->di_cu_context->cc_dbg;
      if (attr._4_4_ == 1) {
        die_local._4_4_ = -1;
      }
      else if (attr._4_4_ == -1) {
        die_local._4_4_ = -1;
      }
      else {
        attr._4_4_ = dwarf_formstring((Dwarf_Attribute)lerr,(char **)error_local,(Dwarf_Error *)dbg)
        ;
        dwarf_dealloc(pDStack_38,lerr,10);
        die_local._4_4_ = attr._4_4_;
      }
    }
  }
  return die_local._4_4_;
}

Assistant:

int
dwarf_die_text(Dwarf_Die die,
    Dwarf_Half   attrnum,
    char       **ret_name,
    Dwarf_Error *error)
{
    Dwarf_Debug dbg = 0;
    int res = DW_DLV_ERROR;
    Dwarf_Attribute attr = 0;
    Dwarf_Error lerr = 0;

    CHECK_DIE(die, DW_DLV_ERROR);

    res = dwarf_attr(die,attrnum,&attr,&lerr);
    dbg = die->di_cu_context->cc_dbg;
    if (res == DW_DLV_ERROR) {
        return DW_DLV_NO_ENTRY;
    }
    if (res == DW_DLV_NO_ENTRY) {
        return res;
    }
    res = dwarf_formstring(attr,ret_name,error);
    dwarf_dealloc(dbg,attr, DW_DLA_ATTR);
    attr = 0;
    return res;
}